

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
::LockCmdQueueAndRun<Diligent::SwapChainVkImpl::Present(unsigned_int)::__0>
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
           *this,SoftwareQueueIndex QueueInd,anon_class_8_1_2bf40e49 Action)

{
  long lVar1;
  Uint32 UVar2;
  Char *Message;
  ICommandQueueVk *pCmdQueueVk;
  lock_guard<std::mutex> local_60;
  lock_guard<std::mutex> Lock;
  CommandQueue *Queue;
  undefined1 local_40 [8];
  string msg;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  anon_class_8_1_2bf40e49 Action_local;
  SoftwareQueueIndex QueueInd_local;
  
  msg.field_2._8_8_ = this;
  this_local = (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                *)Action.PresentInfo;
  Action_local.PresentInfo._7_1_ = QueueInd.m_Value;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int
                    ((IndexWrapper *)((long)&Action_local.PresentInfo + 7));
  if (*(ulong *)(this + 0x1c40) <= (ulong)UVar2) {
    FormatString<char[26],char[27]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xc108a8,
               (char (*) [27])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"LockCmdQueueAndRun",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x107);
    std::__cxx11::string::~string((string *)local_40);
  }
  lVar1 = *(long *)(this + 0x1c48);
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int
                    ((IndexWrapper *)((long)&Action_local.PresentInfo + 7));
  Lock._M_device = (mutex_type *)(lVar1 + (ulong)UVar2 * 0x168);
  std::lock_guard<std::mutex>::lock_guard(&local_60,Lock._M_device);
  pCmdQueueVk = Diligent::RefCntAutoPtr::operator_cast_to_ICommandQueueVk_
                          ((RefCntAutoPtr *)
                           (Lock._M_device[1].super___mutex_base._M_mutex.__size + 8));
  SwapChainVkImpl::Present::anon_class_8_1_2bf40e49::operator()
            ((anon_class_8_1_2bf40e49 *)&this_local,pCmdQueueVk);
  std::lock_guard<std::mutex>::~lock_guard(&local_60);
  return;
}

Assistant:

void LockCmdQueueAndRun(SoftwareQueueIndex QueueInd, TAction Action)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto&                       Queue = m_CommandQueues[QueueInd];
        std::lock_guard<std::mutex> Lock{Queue.Mtx};
        Action(Queue.CmdQueue);
    }